

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end)

{
  ushort uVar1;
  mbedtls_ssl_handshake_params *pmVar2;
  int iVar3;
  char *pcVar4;
  ushort *puVar5;
  char *pcVar6;
  uchar alert_type;
  ulong uVar7;
  ushort *puVar8;
  ushort in;
  int iVar9;
  ushort *puVar10;
  uint local_34;
  
  if (end < buf || (ulong)((long)end - (long)buf) < 2) {
    iVar3 = 0x1738;
LAB_001cee4f:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,iVar3,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
  }
  else {
    uVar7 = (ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8);
    puVar10 = (ushort *)(buf + 2);
    pmVar2 = ssl->handshake;
    pmVar2->received_sig_algs[0x10] = 0;
    pmVar2->received_sig_algs[0x11] = 0;
    pmVar2->received_sig_algs[0x12] = 0;
    pmVar2->received_sig_algs[0x13] = 0;
    pmVar2->received_sig_algs[8] = 0;
    pmVar2->received_sig_algs[9] = 0;
    pmVar2->received_sig_algs[10] = 0;
    pmVar2->received_sig_algs[0xb] = 0;
    pmVar2->received_sig_algs[0xc] = 0;
    pmVar2->received_sig_algs[0xd] = 0;
    pmVar2->received_sig_algs[0xe] = 0;
    pmVar2->received_sig_algs[0xf] = 0;
    pmVar2->received_sig_algs[0] = 0;
    pmVar2->received_sig_algs[1] = 0;
    pmVar2->received_sig_algs[2] = 0;
    pmVar2->received_sig_algs[3] = 0;
    pmVar2->received_sig_algs[4] = 0;
    pmVar2->received_sig_algs[5] = 0;
    pmVar2->received_sig_algs[6] = 0;
    pmVar2->received_sig_algs[7] = 0;
    if (end < puVar10 || (ulong)((long)end - (long)puVar10) < uVar7) {
      iVar3 = 0x173f;
      goto LAB_001cee4f;
    }
    puVar8 = (ushort *)(uVar7 + (long)puVar10);
    local_34 = 0;
LAB_001cecdf:
    uVar7 = (ulong)local_34;
    if (puVar10 < puVar8) {
      if (1 < (ulong)((long)puVar8 - (long)puVar10)) {
        in = *puVar10 << 8 | *puVar10 >> 8;
        puVar10 = puVar10 + 1;
        pcVar4 = mbedtls_ssl_sig_alg_to_str(in);
        mbedtls_debug_print_msg
                  (ssl,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1747,"received signature algorithm: 0x%x %s",(ulong)in,pcVar4);
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) goto code_r0x001ced46;
        goto LAB_001ced7c;
      }
      iVar3 = 0x1742;
      goto LAB_001cee4f;
    }
    if (puVar10 == (ushort *)end) {
      if (local_34 != 0) {
        ssl->handshake->received_sig_algs[uVar7] = 0;
        return 0;
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1762,"no signature algorithm in common");
      alert_type = '(';
      iVar9 = -0x6e00;
      iVar3 = -0x6e00;
      goto LAB_001cee67;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x175b,"Signature algorithms extension length misaligned");
  }
  alert_type = '2';
  iVar9 = -0x7300;
  iVar3 = -0x7300;
LAB_001cee67:
  mbedtls_ssl_pend_fatal_alert(ssl,alert_type,iVar3);
  return iVar9;
code_r0x001ced46:
  iVar3 = mbedtls_ssl_sig_alg_is_supported(ssl,in);
  if ((iVar3 != 0) && (puVar5 = (ushort *)mbedtls_ssl_get_sig_algs(ssl), puVar5 != (ushort *)0x0)) {
    do {
      uVar1 = *puVar5;
      if (uVar1 == 0) goto LAB_001cecdf;
      puVar5 = puVar5 + 1;
    } while (uVar1 != in);
LAB_001ced7c:
    pcVar6 = mbedtls_ssl_sig_alg_to_str(in);
    mbedtls_debug_print_msg
              (ssl,4,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1751,"valid signature algorithm: %s",pcVar6,pcVar4);
    if (local_34 < 0x13) {
      local_34 = local_34 + 1;
      ssl->handshake->received_sig_algs[uVar7] = in;
    }
  }
  goto LAB_001cecdf;
}

Assistant:

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,
                                  const unsigned char *buf,
                                  const unsigned char *end)
{
    const unsigned char *p = buf;
    size_t supported_sig_algs_len = 0;
    const unsigned char *supported_sig_algs_end;
    uint16_t sig_alg;
    uint32_t common_idx = 0;

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, 2);
    supported_sig_algs_len = MBEDTLS_GET_UINT16_BE(p, 0);
    p += 2;

    memset(ssl->handshake->received_sig_algs, 0,
           sizeof(ssl->handshake->received_sig_algs));

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, supported_sig_algs_len);
    supported_sig_algs_end = p + supported_sig_algs_len;
    while (p < supported_sig_algs_end) {
        MBEDTLS_SSL_CHK_BUF_READ_PTR(p, supported_sig_algs_end, 2);
        sig_alg = MBEDTLS_GET_UINT16_BE(p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(4, ("received signature algorithm: 0x%x %s",
                                  sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2 &&
            (!(mbedtls_ssl_sig_alg_is_supported(ssl, sig_alg) &&
               mbedtls_ssl_sig_alg_is_offered(ssl, sig_alg)))) {
            continue;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        MBEDTLS_SSL_DEBUG_MSG(4, ("valid signature algorithm: %s",
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));

        if (common_idx + 1 < MBEDTLS_RECEIVED_SIG_ALGS_SIZE) {
            ssl->handshake->received_sig_algs[common_idx] = sig_alg;
            common_idx += 1;
        }
    }
    /* Check that we consumed all the message. */
    if (p != end) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("Signature algorithms extension length misaligned"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR,
                                     MBEDTLS_ERR_SSL_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (common_idx == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("no signature algorithm in common"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE,
                                     MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE);
        return MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE;
    }

    ssl->handshake->received_sig_algs[common_idx] = MBEDTLS_TLS_SIG_NONE;
    return 0;
}